

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

Attachment *
deqp::gls::fboc::details::makeAttachment
          (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,FboBuilder *builder)

{
  bool bVar1;
  GLuint GVar2;
  Image *pIVar3;
  Renderbuffer *rbCfg;
  RenderbufferAttachment *pRVar4;
  Texture *texCfg;
  
  pIVar3 = makeImage(bufType,format,width,height,builder);
  if (pIVar3 == (Image *)0x0) {
    rbCfg = (Renderbuffer *)0x0;
  }
  else {
    rbCfg = (Renderbuffer *)
            __dynamic_cast(pIVar3,&FboUtil::config::Image::typeinfo,
                           &FboUtil::config::Renderbuffer::typeinfo,0);
  }
  if (rbCfg == (Renderbuffer *)0x0) {
    GVar2 = 0;
    if (pIVar3 == (Image *)0x0) {
      texCfg = (Texture *)0x0;
    }
    else {
      texCfg = (Texture *)
               __dynamic_cast(pIVar3,&FboUtil::config::Image::typeinfo,
                              &FboUtil::config::Texture2D::typeinfo,0);
    }
    bVar1 = texCfg != (Texture *)0x0;
    if (texCfg == (Texture *)0x0) {
      pRVar4 = (RenderbufferAttachment *)0x0;
    }
    else {
      GVar2 = FboUtil::FboBuilder::glCreateTexture(builder,texCfg);
      pRVar4 = (RenderbufferAttachment *)
               FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::TextureFlatAttachment>
                         (builder);
      *(undefined4 *)&pRVar4->field_0x14 = 0xde1;
    }
  }
  else {
    GVar2 = FboUtil::FboBuilder::glCreateRbo(builder,rbCfg);
    pRVar4 = FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>
                       (builder);
    bVar1 = true;
  }
  if (bVar1) {
    (pRVar4->super_Attachment).imageName = GVar2;
  }
  else {
    pRVar4 = (RenderbufferAttachment *)0x0;
  }
  return &pRVar4->super_Attachment;
}

Assistant:

Attachment* makeAttachment (GLenum bufType, ImageFormat format,
							GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* const imgCfg = makeImage (bufType, format, width, height, builder);
	Attachment* att = DE_NULL;
	GLuint img = 0;

	if (Renderbuffer* rboCfg = dynamic_cast<Renderbuffer*>(imgCfg))
	{
		img = builder.glCreateRbo(*rboCfg);
		att = &builder.makeConfig<RenderbufferAttachment>();
	}
	else if (Texture2D* texCfg = dynamic_cast<Texture2D*>(imgCfg))
	{
		img = builder.glCreateTexture(*texCfg);
		TextureFlatAttachment& texAtt = builder.makeConfig<TextureFlatAttachment>();
		texAtt.texTarget = GL_TEXTURE_2D;
		att = &texAtt;
	}
	else
	{
		DE_ASSERT(imgCfg == DE_NULL);
		return DE_NULL;
	}
	att->imageName = img;
	return att;
}